

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.cpp
# Opt level: O0

ssize_t zip_entry_read(zip_t *zip,void **buf,size_t *bufsize)

{
  mz_bool mVar1;
  void *pvVar2;
  undefined8 *in_RDX;
  long *in_RSI;
  mz_zip_archive *in_RDI;
  size_t size;
  mz_uint idx;
  mz_zip_archive *pzip;
  mz_uint in_stack_00000444;
  size_t *in_stack_00000448;
  mz_uint in_stack_00000454;
  mz_zip_archive *in_stack_00000458;
  ssize_t local_8;
  
  if (in_RDI == (mz_zip_archive *)0x0) {
    local_8 = -1;
  }
  else if ((in_RDI->m_zip_mode == MZ_ZIP_MODE_READING) &&
          (-1 < (long)in_RDI[1].m_central_directory_file_ofs)) {
    mVar1 = mz_zip_reader_is_file_a_directory
                      (in_RDI,(mz_uint)in_RDI[1].m_central_directory_file_ofs);
    if (mVar1 == 0) {
      pvVar2 = mz_zip_reader_extract_to_heap
                         (in_stack_00000458,in_stack_00000454,in_stack_00000448,in_stack_00000444);
      *in_RSI = (long)pvVar2;
      if ((*in_RSI != 0) && (in_RDX != (undefined8 *)0x0)) {
        *in_RDX = 0;
      }
      local_8 = 0;
    }
    else {
      local_8 = -0x11;
    }
  }
  else {
    local_8 = -3;
  }
  return local_8;
}

Assistant:

ssize_t zip_entry_read(struct zip_t *zip, void **buf, size_t *bufsize) {
  mz_zip_archive *pzip = NULL;
  mz_uint idx;
  size_t size = 0;

  if (!zip) {
    // zip_t handler is not initialized
    return (ssize_t)ZIP_ENOINIT;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING ||
      zip->entry.index < (ssize_t)0) {
    // the entry is not found or we do not have read access
    return (ssize_t)ZIP_ENOENT;
  }

  idx = (mz_uint)zip->entry.index;
  if (mz_zip_reader_is_file_a_directory(pzip, idx)) {
    // the entry is a directory
    return (ssize_t)ZIP_EINVENTTYPE;
  }

  *buf = mz_zip_reader_extract_to_heap(pzip, idx, &size, 0);
  if (*buf && bufsize) {
    *bufsize = size;
  }
  return (ssize_t)size;
}